

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawWall4PalCommand::Execute(DrawWall4PalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  int iVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  uint8_t *puVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  uint8_t *puVar26;
  uint uVar27;
  
  puVar26 = (this->super_PalWall4Command)._dest;
  iVar1 = (this->super_PalWall4Command)._fracbits;
  puVar11 = (this->super_PalWall4Command)._colormap[0];
  puVar12 = (this->super_PalWall4Command)._colormap[1];
  puVar13 = (this->super_PalWall4Command)._colormap[2];
  puVar14 = (this->super_PalWall4Command)._colormap[3];
  puVar15 = (this->super_PalWall4Command)._source[0];
  puVar16 = (this->super_PalWall4Command)._source[1];
  puVar17 = (this->super_PalWall4Command)._source[2];
  puVar18 = (this->super_PalWall4Command)._source[3];
  uVar2 = (this->super_PalWall4Command)._iscale[0];
  uVar3 = (this->super_PalWall4Command)._iscale[1];
  uVar4 = (this->super_PalWall4Command)._iscale[2];
  uVar5 = (this->super_PalWall4Command)._iscale[3];
  uVar6 = (this->super_PalWall4Command)._texturefrac[0];
  uVar7 = (this->super_PalWall4Command)._texturefrac[1];
  uVar8 = (this->super_PalWall4Command)._texturefrac[2];
  uVar9 = (this->super_PalWall4Command)._texturefrac[3];
  iVar10 = (this->super_PalWall4Command)._pitch;
  iVar19 = DrawerThread::count_for_thread
                     (thread,(this->super_PalWall4Command).super_DrawerCommand._dest_y,
                      (this->super_PalWall4Command)._count);
  if (0 < iVar19) {
    iVar20 = DrawerThread::skipped_by_thread
                       (thread,(this->super_PalWall4Command).super_DrawerCommand._dest_y);
    iVar21 = DrawerThread::skipped_by_thread
                       (thread,(this->super_PalWall4Command).super_DrawerCommand._dest_y);
    uVar22 = iVar20 * uVar2 + uVar6;
    uVar24 = iVar20 * uVar3 + uVar7;
    uVar25 = iVar20 * uVar4 + uVar8;
    uVar27 = iVar20 * uVar5 + uVar9;
    iVar20 = thread->num_cores;
    puVar26 = puVar26 + (long)(iVar21 * iVar10) + 3;
    do {
      bVar23 = (byte)iVar1;
      puVar26[-3] = puVar11[puVar15[uVar22 >> (bVar23 & 0x3f)]];
      puVar26[-2] = puVar12[puVar16[uVar24 >> (bVar23 & 0x3f)]];
      puVar26[-1] = puVar13[puVar17[uVar25 >> (bVar23 & 0x3f)]];
      *puVar26 = puVar14[puVar18[uVar27 >> (bVar23 & 0x3f)]];
      uVar22 = uVar22 + uVar2 * iVar20;
      uVar24 = uVar24 + uVar3 * iVar20;
      uVar25 = uVar25 + uVar4 * iVar20;
      uVar27 = uVar27 + uVar5 * iVar20;
      puVar26 = puVar26 + iVar20 * iVar10;
      iVar19 = iVar19 + -1;
    } while (iVar19 != 0);
  }
  return;
}

Assistant:

void DrawWall4PalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *dest = _dest;
		int count = _count;
		int bits = _fracbits;
		uint32_t place;
		auto pal0 = _colormap[0];
		auto pal1 = _colormap[1];
		auto pal2 = _colormap[2];
		auto pal3 = _colormap[3];
		auto buf0 = _source[0];
		auto buf1 = _source[1];
		auto buf2 = _source[2];
		auto buf3 = _source[3];
		auto dc_wall_iscale0 = _iscale[0];
		auto dc_wall_iscale1 = _iscale[1];
		auto dc_wall_iscale2 = _iscale[2];
		auto dc_wall_iscale3 = _iscale[3];
		auto dc_wall_texturefrac0 = _texturefrac[0];
		auto dc_wall_texturefrac1 = _texturefrac[1];
		auto dc_wall_texturefrac2 = _texturefrac[2];
		auto dc_wall_texturefrac3 = _texturefrac[3];
		auto pitch = _pitch;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int skipped = thread->skipped_by_thread(_dest_y);
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		dc_wall_texturefrac0 += dc_wall_iscale0 * skipped;
		dc_wall_texturefrac1 += dc_wall_iscale1 * skipped;
		dc_wall_texturefrac2 += dc_wall_iscale2 * skipped;
		dc_wall_texturefrac3 += dc_wall_iscale3 * skipped;
		dc_wall_iscale0 *= thread->num_cores;
		dc_wall_iscale1 *= thread->num_cores;
		dc_wall_iscale2 *= thread->num_cores;
		dc_wall_iscale3 *= thread->num_cores;
		pitch *= thread->num_cores;

		do
		{
			dest[0] = pal0[buf0[(place = dc_wall_texturefrac0) >> bits]]; dc_wall_texturefrac0 = place + dc_wall_iscale0;
			dest[1] = pal1[buf1[(place = dc_wall_texturefrac1) >> bits]]; dc_wall_texturefrac1 = place + dc_wall_iscale1;
			dest[2] = pal2[buf2[(place = dc_wall_texturefrac2) >> bits]]; dc_wall_texturefrac2 = place + dc_wall_iscale2;
			dest[3] = pal3[buf3[(place = dc_wall_texturefrac3) >> bits]]; dc_wall_texturefrac3 = place + dc_wall_iscale3;
			dest += pitch;
		} while (--count);
	}